

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  undefined1 (*pauVar18) [16];
  int iVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  size_t sVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  float fVar69;
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar79;
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar89 [16];
  Vec3fa n0;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  Vec3fa n1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar100 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  size_t local_1c0;
  size_t local_1b8;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  anon_class_16_2_07cfa4d6 local_f8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar27._8_8_ = 0;
  auVar27._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar27._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar29._8_8_ = 0;
  auVar29._0_4_ = time_range->lower;
  auVar29._4_4_ = time_range->upper;
  uVar25 = vcmpps_avx512vl(auVar27,auVar29,1);
  auVar26 = vinsertps_avx(auVar29,auVar27,0x50);
  auVar27 = vinsertps_avx512f(auVar27,auVar29,0x50);
  bVar9 = (bool)((byte)uVar25 & 1);
  auVar28._0_4_ = (uint)bVar9 * auVar26._0_4_ | (uint)!bVar9 * auVar27._0_4_;
  bVar9 = (bool)((byte)(uVar25 >> 1) & 1);
  auVar28._4_4_ = (uint)bVar9 * auVar26._4_4_ | (uint)!bVar9 * auVar27._4_4_;
  bVar9 = (bool)((byte)(uVar25 >> 2) & 1);
  auVar28._8_4_ = (uint)bVar9 * auVar26._8_4_ | (uint)!bVar9 * auVar27._8_4_;
  bVar9 = (bool)((byte)(uVar25 >> 3) & 1);
  auVar28._12_4_ = (uint)bVar9 * auVar26._12_4_ | (uint)!bVar9 * auVar27._12_4_;
  local_118 = vmovshdup_avx512vl(auVar28);
  auVar99 = ZEXT1664(local_118);
  local_108 = vucomiss_avx512f(local_118);
  auVar98 = ZEXT1664(local_108);
  if (&stack0xffffffffffffffd0 < (undefined1 *)0x1d8 || &stack0x00000000 == (undefined1 *)0x208) {
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    uVar25 = r->_begin;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1c0 = __return_storage_ptr__->end;
    if (uVar25 < r->_end) {
      auVar70 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar26 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
      auVar100 = ZEXT1664(auVar26);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
      auVar96 = ZEXT1664(auVar26);
      auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
      auVar97 = ZEXT1664(auVar26);
      local_1b8 = k;
      do {
        auVar28 = auVar70._0_16_;
        BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar30._8_8_ = 0;
        auVar30._0_4_ = BVar1.lower;
        auVar30._4_4_ = BVar1.upper;
        auVar26 = vmovshdup_avx(auVar30);
        fVar12 = auVar26._0_4_ - BVar1.lower;
        auVar26 = vsubss_avx512f(auVar98._0_16_,auVar30);
        auVar38._0_4_ = auVar26._0_4_ / fVar12;
        auVar38._4_12_ = auVar26._4_12_;
        auVar26 = vsubss_avx512f(auVar99._0_16_,auVar30);
        auVar31._0_4_ = auVar26._0_4_ / fVar12;
        auVar31._4_12_ = auVar26._4_12_;
        auVar26 = vmulss_avx512f(auVar38,SUB6416(ZEXT464(0x3f800002),0));
        auVar27 = vmulss_avx512f(auVar31,SUB6416(ZEXT464(0x3f7ffffc),0));
        uVar20 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar25);
        uVar15 = (ulong)uVar20;
        uVar16 = (ulong)(uVar20 + 1);
        pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar16 < (pBVar2->super_RawBufferView).num) {
          fVar12 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar26 = ZEXT416((uint)(fVar12 * auVar26._0_4_));
          auVar26 = vroundss_avx(auVar26,auVar26,9);
          auVar26 = vmaxss_avx(auVar28,auVar26);
          uVar20 = (uint)auVar26._0_4_;
          auVar26 = ZEXT416((uint)(fVar12 * auVar27._0_4_));
          auVar26 = vroundss_avx(auVar26,auVar26,10);
          auVar26 = vminss_avx(auVar26,ZEXT416((uint)fVar12));
          uVar23 = (uint)auVar26._0_4_;
          bVar9 = uVar23 < uVar20;
          auVar26 = auVar98._0_16_;
          auVar27 = auVar99._0_16_;
          if (uVar20 <= uVar23) {
            uVar21 = (ulong)(int)uVar20;
            lVar22 = uVar21 * 0x38;
            pcVar3 = pBVar2[uVar21].super_RawBufferView.ptr_ofs;
            sVar24 = pBVar2[uVar21].super_RawBufferView.stride;
            auVar26 = *(undefined1 (*) [16])(pcVar3 + sVar24 * uVar15);
            uVar13 = vcmpps_avx512vl(auVar26,auVar96._0_16_,6);
            uVar14 = vcmpps_avx512vl(auVar26,auVar97._0_16_,1);
            if ((byte)((byte)uVar13 & (byte)uVar14) == 0xf) {
              pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.normals.items;
              pBVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.tangents.items;
              pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.dnormals.items;
              fVar57 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.maxRadiusScale;
              pauVar18 = (undefined1 (*) [16])(pcVar3 + sVar24 * uVar16);
              auVar41 = bezier_basis0._3944_32_;
              do {
                auVar27 = *pauVar18;
                auVar28 = auVar96._0_16_;
                uVar13 = vcmpps_avx512vl(auVar27,auVar28,6);
                auVar29 = auVar97._0_16_;
                uVar14 = vcmpps_avx512vl(auVar27,auVar29,1);
                if ((byte)((byte)uVar13 & (byte)uVar14) != 0xf) break;
                lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar22);
                lVar8 = *(long *)((long)&(pBVar5->super_RawBufferView).stride + lVar22);
                auVar30 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar15);
                uVar13 = vcmpps_avx512vl(auVar30,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar30,auVar29,1);
                if ((byte)((byte)uVar13 & (byte)uVar14) != 0xf) break;
                auVar31 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar16);
                uVar13 = vcmpps_avx512vl(auVar31,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar31,auVar29,1);
                if ((byte)((byte)uVar13 & (byte)uVar14) != 0xf) break;
                lVar7 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar22);
                lVar8 = *(long *)((long)&(pBVar4->super_RawBufferView).stride + lVar22);
                auVar38 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar15);
                uVar13 = vcmpps_avx512vl(auVar38,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar38,auVar29,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) break;
                auVar39 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar16);
                uVar13 = vcmpps_avx512vl(auVar39,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar39,auVar29,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) break;
                lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar22);
                lVar8 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar22);
                auVar32 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar15);
                uVar13 = vcmpps_avx512vl(auVar32,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar32,auVar29,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) break;
                auVar33 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar16);
                auVar43._16_16_ = auVar41._16_16_;
                uVar13 = vcmpps_avx512vl(auVar33,auVar28,6);
                uVar14 = vcmpps_avx512vl(auVar33,auVar29,1);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) break;
                auVar28 = vshufps_avx512vl(auVar26,auVar26,0xff);
                auVar28 = vmulss_avx512f(auVar28,ZEXT416((uint)fVar57));
                auVar28 = vinsertps_avx512f(auVar26,auVar28,0x30);
                auVar26 = vshufps_avx(auVar27,auVar27,0xff);
                auVar27 = vinsertps_avx512f(auVar27,ZEXT416((uint)(auVar26._0_4_ * fVar57)),0x30);
                auVar26 = vshufps_avx(auVar30,auVar30,0xff);
                auVar29 = vinsertps_avx512f(auVar30,ZEXT416((uint)(auVar26._0_4_ * fVar57)),0x30);
                auVar26 = vshufps_avx(auVar31,auVar31,0xff);
                auVar26 = vinsertps_avx512f(auVar31,ZEXT416((uint)(auVar26._0_4_ * fVar57)),0x30);
                auVar34._8_4_ = 0xbeaaaaab;
                auVar34._0_8_ = 0xbeaaaaabbeaaaaab;
                auVar34._12_4_ = 0xbeaaaaab;
                auVar29 = vfnmadd213ps_avx512vl(auVar29,auVar34,auVar28);
                auVar30 = vfmadd213ps_avx512vl(auVar26,auVar34,auVar27);
                auVar26 = vfnmadd213ps_fma(auVar32,auVar34,auVar38);
                auVar31 = vfmadd213ps_avx512vl(auVar33,auVar34,auVar39);
                auVar35 = auVar100._0_16_;
                auVar32 = vmulps_avx512vl(auVar27,auVar35);
                auVar32 = vfmadd231ps_avx512vl(auVar32,auVar30,auVar35);
                auVar33 = vfmadd213ps_avx512vl(ZEXT816(0),auVar29,auVar32);
                auVar33 = vaddps_avx512vl(auVar28,auVar33);
                auVar61._8_4_ = 0x40400000;
                auVar61._0_8_ = 0x4040000040400000;
                auVar61._12_4_ = 0x40400000;
                auVar32 = vfmadd231ps_avx512vl(auVar32,auVar29,auVar61);
                auVar32 = vfnmadd231ps_avx512vl(auVar32,auVar28,auVar61);
                auVar34 = vmulps_avx512vl(auVar39,auVar35);
                auVar34 = vfmadd231ps_avx512vl(auVar34,auVar31,auVar35);
                auVar35 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar26,auVar34);
                auVar58 = ZEXT816(0);
                auVar35 = vaddps_avx512vl(auVar38,auVar35);
                auVar34 = vfmadd231ps_avx512vl(auVar34,auVar26,auVar61);
                auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar38,auVar61);
                auVar36 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar30,auVar27);
                auVar36 = vfmadd231ps_avx512vl(auVar36,auVar29,auVar58);
                auVar36 = vfmadd231ps_avx512vl(auVar36,auVar28,auVar58);
                auVar27 = vmulps_avx512vl(auVar27,auVar61);
                auVar27 = vfnmadd231ps_avx512vl(auVar27,auVar61,auVar30);
                auVar27 = vfmadd231ps_avx512vl(auVar27,auVar58,auVar29);
                auVar37 = vfnmadd231ps_avx512vl(auVar27,auVar58,auVar28);
                auVar27 = vxorps_avx512vl(auVar28,auVar28);
                auVar27 = vfmadd213ps_avx512vl(auVar27,auVar31,auVar39);
                auVar27 = vfmadd231ps_avx512vl(auVar27,auVar26,auVar58);
                auVar29 = vfmadd231ps_avx512vl(auVar27,auVar38,auVar58);
                auVar93._0_4_ = auVar39._0_4_ * 3.0;
                auVar93._4_4_ = auVar39._4_4_ * 3.0;
                auVar93._8_4_ = auVar39._8_4_ * 3.0;
                auVar93._12_4_ = auVar39._12_4_ * 3.0;
                auVar27 = vfnmadd231ps_avx512vl(auVar93,auVar61,auVar31);
                auVar26 = vfmadd231ps_fma(auVar27,auVar58,auVar26);
                auVar27 = vfnmadd231ps_fma(auVar26,auVar58,auVar38);
                auVar26 = vshufps_avx(auVar32,auVar32,0xc9);
                auVar28 = vshufps_avx512vl(auVar35,auVar35,0xc9);
                auVar94._0_4_ = auVar32._0_4_ * auVar28._0_4_;
                auVar94._4_4_ = auVar32._4_4_ * auVar28._4_4_;
                auVar94._8_4_ = auVar32._8_4_ * auVar28._8_4_;
                auVar94._12_4_ = auVar32._12_4_ * auVar28._12_4_;
                auVar28 = vfmsub231ps_avx512vl(auVar94,auVar26,auVar35);
                auVar43._0_16_ = vxorps_avx512vl(auVar35,auVar35);
                auVar100 = ZEXT1664(auVar43._0_16_);
                auVar28 = vshufps_avx(auVar28,auVar28,0xc9);
                auVar30 = vshufps_avx512vl(auVar34,auVar34,0xc9);
                auVar30 = vmulps_avx512vl(auVar32,auVar30);
                auVar26 = vfmsub231ps_avx512vl(auVar30,auVar26,auVar34);
                auVar30 = vshufps_avx512vl(auVar26,auVar26,0xc9);
                auVar26 = vshufps_avx512vl(auVar37,auVar37,0xc9);
                auVar31 = vshufps_avx512vl(auVar29,auVar29,0xc9);
                auVar90._0_4_ = auVar37._0_4_ * auVar31._0_4_;
                auVar90._4_4_ = auVar37._4_4_ * auVar31._4_4_;
                auVar90._8_4_ = auVar37._8_4_ * auVar31._8_4_;
                auVar90._12_4_ = auVar37._12_4_ * auVar31._12_4_;
                auVar29 = vfmsub231ps_avx512vl(auVar90,auVar26,auVar29);
                auVar29 = vshufps_avx(auVar29,auVar29,0xc9);
                auVar31 = vshufps_avx512vl(auVar27,auVar27,0xc9);
                auVar31 = vmulps_avx512vl(auVar37,auVar31);
                auVar26 = vfmsub231ps_avx512vl(auVar31,auVar26,auVar27);
                auVar31 = vshufps_avx512vl(auVar26,auVar26,0xc9);
                auVar26 = vdpps_avx(auVar28,auVar28,0x7f);
                auVar40._4_28_ = auVar43._4_28_;
                auVar40._0_4_ = auVar26._0_4_;
                auVar27 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar40._0_16_);
                auVar38 = vmulss_avx512f(auVar27,SUB6416(ZEXT464(0x3fc00000),0));
                auVar39 = vmulss_avx512f(auVar26,ZEXT416(0x3f000000));
                auVar39 = vmulss_avx512f(auVar39,auVar27);
                auVar27 = vmulss_avx512f(auVar27,auVar27);
                auVar27 = vmulss_avx512f(auVar39,auVar27);
                auVar38 = vsubss_avx512f(auVar38,auVar27);
                auVar27 = vdpps_avx(auVar28,auVar30,0x7f);
                auVar38 = vbroadcastss_avx512vl(auVar38);
                auVar39 = vmulps_avx512vl(auVar38,auVar28);
                auVar34 = vbroadcastss_avx512vl(auVar26);
                auVar30 = vmulps_avx512vl(auVar34,auVar30);
                fVar69 = auVar27._0_4_;
                auVar35._0_4_ = auVar28._0_4_ * fVar69;
                auVar35._4_4_ = auVar28._4_4_ * fVar69;
                auVar35._8_4_ = auVar28._8_4_ * fVar69;
                auVar35._12_4_ = auVar28._12_4_ * fVar69;
                auVar27 = vsubps_avx(auVar30,auVar35);
                auVar28 = vrcp14ss_avx512f(auVar43._0_16_,auVar40._0_16_);
                auVar26 = vfnmadd213ss_avx512f(auVar26,auVar28,ZEXT416(0x40000000));
                fVar69 = auVar28._0_4_ * auVar26._0_4_;
                auVar26._0_4_ = fVar69 * auVar27._0_4_;
                auVar26._4_4_ = fVar69 * auVar27._4_4_;
                auVar26._8_4_ = fVar69 * auVar27._8_4_;
                auVar26._12_4_ = fVar69 * auVar27._12_4_;
                auVar30 = vmulps_avx512vl(auVar38,auVar26);
                auVar26 = vdpps_avx(auVar29,auVar29,0x7f);
                auVar45._16_16_ = auVar43._16_16_;
                auVar45._0_16_ = auVar43._0_16_;
                auVar42._4_28_ = auVar45._4_28_;
                auVar42._0_4_ = auVar26._0_4_;
                auVar27 = vrsqrt14ss_avx512f(auVar43._0_16_,auVar42._0_16_);
                auVar28 = vmulss_avx512f(auVar27,SUB6416(ZEXT464(0x3fc00000),0));
                auVar38 = vmulss_avx512f(auVar26,ZEXT416(0x3f000000));
                auVar38 = vmulss_avx512f(auVar38,auVar27);
                auVar27 = vmulss_avx512f(auVar38,ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)));
                auVar27 = vsubss_avx512f(auVar28,auVar27);
                auVar95._0_4_ = auVar27._0_4_;
                auVar95._4_4_ = auVar95._0_4_;
                auVar95._8_4_ = auVar95._0_4_;
                auVar95._12_4_ = auVar95._0_4_;
                auVar27 = vdpps_avx(auVar29,auVar31,0x7f);
                auVar38 = vmulps_avx512vl(auVar29,auVar95);
                auVar28 = vbroadcastss_avx512vl(auVar26);
                auVar28 = vmulps_avx512vl(auVar28,auVar31);
                fVar69 = auVar27._0_4_;
                auVar58._0_4_ = auVar29._0_4_ * fVar69;
                auVar58._4_4_ = auVar29._4_4_ * fVar69;
                auVar58._8_4_ = auVar29._8_4_ * fVar69;
                auVar58._12_4_ = auVar29._12_4_ * fVar69;
                auVar28 = vsubps_avx(auVar28,auVar58);
                auVar27 = vrcp14ss_avx512f(auVar43._0_16_,auVar42._0_16_);
                auVar26 = vfnmadd213ss_avx512f(auVar26,auVar27,ZEXT416(0x40000000));
                fVar69 = auVar27._0_4_ * auVar26._0_4_;
                auVar26 = vshufps_avx(auVar33,auVar33,0xff);
                auVar31 = vmulps_avx512vl(auVar26,auVar39);
                auVar29 = vsubps_avx(auVar33,auVar31);
                auVar27 = vshufps_avx(auVar32,auVar32,0xff);
                auVar27 = vmulps_avx512vl(auVar27,auVar39);
                auVar39._0_4_ = auVar27._0_4_ + auVar26._0_4_ * auVar30._0_4_;
                auVar39._4_4_ = auVar27._4_4_ + auVar26._4_4_ * auVar30._4_4_;
                auVar39._8_4_ = auVar27._8_4_ + auVar26._8_4_ * auVar30._8_4_;
                auVar39._12_4_ = auVar27._12_4_ + auVar26._12_4_ * auVar30._12_4_;
                auVar30 = vsubps_avx(auVar32,auVar39);
                fVar85 = auVar33._0_4_ + auVar31._0_4_;
                fVar86 = auVar33._4_4_ + auVar31._4_4_;
                fVar87 = auVar33._8_4_ + auVar31._8_4_;
                fVar88 = auVar33._12_4_ + auVar31._12_4_;
                auVar91._0_4_ = auVar32._0_4_ + auVar39._0_4_;
                auVar91._4_4_ = auVar32._4_4_ + auVar39._4_4_;
                auVar91._8_4_ = auVar32._8_4_ + auVar39._8_4_;
                auVar91._12_4_ = auVar32._12_4_ + auVar39._12_4_;
                auVar26 = vshufps_avx(auVar36,auVar36,0xff);
                auVar39 = vmulps_avx512vl(auVar26,auVar38);
                auVar31 = vsubps_avx(auVar36,auVar39);
                auVar27 = vshufps_avx(auVar37,auVar37,0xff);
                auVar27 = vmulps_avx512vl(auVar27,auVar38);
                auVar32._0_4_ =
                     auVar27._0_4_ + auVar26._0_4_ * auVar95._0_4_ * auVar28._0_4_ * fVar69;
                auVar32._4_4_ =
                     auVar27._4_4_ + auVar26._4_4_ * auVar95._0_4_ * auVar28._4_4_ * fVar69;
                auVar32._8_4_ =
                     auVar27._8_4_ + auVar26._8_4_ * auVar95._0_4_ * auVar28._8_4_ * fVar69;
                auVar32._12_4_ =
                     auVar27._12_4_ + auVar26._12_4_ * auVar95._0_4_ * auVar28._12_4_ * fVar69;
                auVar26 = vsubps_avx(auVar37,auVar32);
                auVar89._0_4_ = auVar36._0_4_ + auVar39._0_4_;
                auVar89._4_4_ = auVar36._4_4_ + auVar39._4_4_;
                auVar89._8_4_ = auVar36._8_4_ + auVar39._8_4_;
                auVar89._12_4_ = auVar36._12_4_ + auVar39._12_4_;
                auVar36._0_4_ = auVar37._0_4_ + auVar32._0_4_;
                auVar36._4_4_ = auVar37._4_4_ + auVar32._4_4_;
                auVar36._8_4_ = auVar37._8_4_ + auVar32._8_4_;
                auVar36._12_4_ = auVar37._12_4_ + auVar32._12_4_;
                auVar27 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
                auVar28 = vmulps_avx512vl(auVar30,auVar27);
                fVar69 = auVar29._0_4_;
                auVar33._0_4_ = fVar69 + auVar28._0_4_;
                auVar33._4_4_ = auVar29._4_4_ + auVar28._4_4_;
                auVar33._8_4_ = auVar29._8_4_ + auVar28._8_4_;
                auVar33._12_4_ = auVar29._12_4_ + auVar28._12_4_;
                auVar26 = vmulps_avx512vl(auVar26,auVar27);
                auVar26 = vsubps_avx(auVar31,auVar26);
                auVar68._4_4_ = fVar69;
                auVar68._0_4_ = fVar69;
                auVar68._8_4_ = fVar69;
                auVar68._12_4_ = fVar69;
                auVar68._16_4_ = fVar69;
                auVar68._20_4_ = fVar69;
                auVar68._24_4_ = fVar69;
                auVar68._28_4_ = fVar69;
                auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
                auVar41 = vpermps_avx512vl(auVar40,ZEXT1632(auVar29));
                auVar42 = vbroadcastss_avx512vl(ZEXT416(2));
                auVar43 = vpermps_avx512vl(auVar42,ZEXT1632(auVar29));
                auVar44 = vbroadcastss_avx512vl(auVar33);
                auVar45 = vpermps_avx512vl(auVar40,ZEXT1632(auVar33));
                auVar46 = vpermps_avx512vl(auVar42,ZEXT1632(auVar33));
                auVar47 = vbroadcastss_avx512vl(auVar26);
                auVar48 = vpermps_avx512vl(auVar40,ZEXT1632(auVar26));
                auVar49 = vpermps_avx512vl(auVar42,ZEXT1632(auVar26));
                auVar50 = vbroadcastss_avx512vl(auVar31);
                auVar51 = vpermps_avx512vl(auVar40,ZEXT1632(auVar31));
                auVar52 = vpermps_avx512vl(auVar42,ZEXT1632(auVar31));
                auVar53 = vmulps_avx512vl(auVar50,bezier_basis0._3944_32_);
                auVar53 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._2788_32_,auVar47);
                auVar50 = vmulps_avx512vl(auVar50,bezier_basis0._8568_32_);
                auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._7412_32_,auVar47);
                auVar47 = vmulps_avx512vl(auVar51,bezier_basis0._3944_32_);
                auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar48);
                auVar51 = vmulps_avx512vl(auVar51,bezier_basis0._8568_32_);
                auVar48 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._7412_32_,auVar48);
                auVar51 = vmulps_avx512vl(auVar52,bezier_basis0._3944_32_);
                auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar49);
                auVar53 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._1632_32_,auVar44);
                auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._1632_32_,auVar45);
                auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar46);
                auVar53 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._476_32_,auVar68);
                auVar54 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._476_32_,auVar41);
                auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar43);
                auVar47._4_4_ = auVar52._4_4_ * bezier_basis0._8572_4_;
                auVar47._0_4_ = auVar52._0_4_ * bezier_basis0._8568_4_;
                auVar47._8_4_ = auVar52._8_4_ * bezier_basis0._8576_4_;
                auVar47._12_4_ = auVar52._12_4_ * bezier_basis0._8580_4_;
                auVar47._16_4_ = auVar52._16_4_ * bezier_basis0._8584_4_;
                auVar47._20_4_ = auVar52._20_4_ * bezier_basis0._8588_4_;
                auVar47._24_4_ = auVar52._24_4_ * bezier_basis0._8592_4_;
                auVar47._28_4_ = auVar52._28_4_;
                auVar26 = vfmadd231ps_fma(auVar47,bezier_basis0._7412_32_,auVar49);
                auVar47 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._6256_32_,auVar44);
                auVar44 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._6256_32_,auVar45);
                auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),bezier_basis0._6256_32_,auVar46);
                auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._5100_32_,auVar68);
                auVar41 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._5100_32_,auVar41);
                auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),bezier_basis0._5100_32_,auVar43);
                auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
                auVar46 = vmulps_avx512vl(auVar47,auVar45);
                auVar48 = vmulps_avx512vl(auVar41,auVar45);
                auVar49 = vmulps_avx512vl(ZEXT1632(auVar26),auVar45);
                auVar31 = ZEXT816(0) << 0x40;
                auVar41 = vblendps_avx(auVar46,ZEXT1632(auVar31),1);
                auVar43 = vblendps_avx(auVar48,ZEXT1632(auVar31),1);
                auVar55 = ZEXT1632(auVar31);
                auVar47 = vblendps_avx(auVar49,auVar55,1);
                auVar44 = vsubps_avx(auVar53,auVar41);
                auVar50 = vsubps_avx512vl(auVar54,auVar43);
                auVar52 = vsubps_avx512vl(auVar51,auVar47);
                auVar41 = vblendps_avx(auVar46,auVar55,0x80);
                auVar43 = vblendps_avx(auVar48,auVar55,0x80);
                auVar47 = vblendps_avx(auVar49,auVar55,0x80);
                auVar56._0_4_ = auVar53._0_4_ + auVar41._0_4_;
                auVar56._4_4_ = auVar53._4_4_ + auVar41._4_4_;
                auVar56._8_4_ = auVar53._8_4_ + auVar41._8_4_;
                auVar56._12_4_ = auVar53._12_4_ + auVar41._12_4_;
                auVar56._16_4_ = auVar53._16_4_ + auVar41._16_4_;
                auVar56._20_4_ = auVar53._20_4_ + auVar41._20_4_;
                auVar56._24_4_ = auVar53._24_4_ + auVar41._24_4_;
                auVar56._28_4_ = auVar53._28_4_ + auVar41._28_4_;
                auVar43 = vaddps_avx512vl(auVar54,auVar43);
                auVar47 = vaddps_avx512vl(auVar51,auVar47);
                auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar41 = vminps_avx512vl(auVar46,auVar53);
                auVar48 = vminps_avx512vl(auVar46,auVar54);
                auVar49 = vminps_avx512vl(auVar46,auVar51);
                auVar55 = vminps_avx512vl(auVar44,auVar56);
                auVar55 = vminps_avx512vl(auVar41,auVar55);
                auVar41 = vminps_avx512vl(auVar50,auVar43);
                auVar48 = vminps_avx512vl(auVar48,auVar41);
                auVar41 = vminps_avx512vl(auVar52,auVar47);
                auVar49 = vminps_avx512vl(auVar49,auVar41);
                auVar41 = vmaxps_avx(auVar44,auVar56);
                auVar29 = vmulps_avx512vl(auVar91,auVar27);
                fVar69 = fVar85 + auVar29._0_4_;
                auVar26 = vmulps_avx512vl(auVar36,auVar27);
                auVar30 = vsubps_avx512vl(auVar89,auVar26);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                auVar44 = vmaxps_avx512vl(auVar56,auVar53);
                auVar53 = vmaxps_avx512vl(auVar56,auVar54);
                auVar51 = vmaxps_avx512vl(auVar56,auVar51);
                auVar41 = vmaxps_avx(auVar44,auVar41);
                auVar43 = vmaxps_avx(auVar50,auVar43);
                auVar43 = vmaxps_avx(auVar53,auVar43);
                auVar47 = vmaxps_avx(auVar52,auVar47);
                auVar47 = vmaxps_avx(auVar51,auVar47);
                auVar44 = vshufps_avx512vl(auVar55,auVar55,0xb1);
                auVar50 = vminps_avx512vl(auVar55,auVar44);
                auVar44 = vshufpd_avx(auVar50,auVar50,5);
                auVar44 = vminps_avx(auVar50,auVar44);
                auVar26 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
                auVar44 = vshufps_avx512vl(auVar48,auVar48,0xb1);
                auVar48 = vminps_avx512vl(auVar48,auVar44);
                auVar44 = vshufpd_avx(auVar48,auVar48,5);
                auVar44 = vminps_avx(auVar48,auVar44);
                auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
                auVar27 = vunpcklps_avx(auVar26,auVar27);
                auVar44 = vshufps_avx512vl(auVar49,auVar49,0xb1);
                auVar48 = vminps_avx512vl(auVar49,auVar44);
                auVar99 = ZEXT1664(local_118);
                auVar44 = vshufpd_avx(auVar48,auVar48,5);
                auVar44 = vminps_avx(auVar48,auVar44);
                auVar26 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
                auVar26 = vinsertps_avx(auVar27,auVar26,0x28);
                auVar44 = vshufps_avx(auVar41,auVar41,0xb1);
                auVar41 = vmaxps_avx(auVar41,auVar44);
                auVar44 = vshufpd_avx(auVar41,auVar41,5);
                auVar41 = vmaxps_avx(auVar41,auVar44);
                auVar27 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
                auVar41 = vshufps_avx(auVar43,auVar43,0xb1);
                auVar41 = vmaxps_avx(auVar43,auVar41);
                auVar43 = vshufpd_avx(auVar41,auVar41,5);
                auVar41 = vmaxps_avx(auVar41,auVar43);
                auVar28 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
                auVar28 = vunpcklps_avx(auVar27,auVar28);
                auVar41 = vshufps_avx(auVar47,auVar47,0xb1);
                auVar41 = vmaxps_avx(auVar47,auVar41);
                auVar43 = vshufpd_avx(auVar41,auVar41,5);
                auVar41 = vmaxps_avx(auVar41,auVar43);
                auVar27 = vmaxps_avx(auVar41._0_16_,auVar41._16_16_);
                auVar27 = vinsertps_avx(auVar28,auVar27,0x28);
                auVar54._4_4_ = fVar85;
                auVar54._0_4_ = fVar85;
                auVar54._8_4_ = fVar85;
                auVar54._12_4_ = fVar85;
                auVar54._16_4_ = fVar85;
                auVar54._20_4_ = fVar85;
                auVar54._24_4_ = fVar85;
                auVar54._28_4_ = fVar85;
                auVar43 = ZEXT1632(CONCAT412(fVar88,CONCAT48(fVar87,CONCAT44(fVar86,fVar85))));
                auVar41 = vpermps_avx512vl(auVar40,auVar43);
                auVar43 = vpermps_avx512vl(auVar42,auVar43);
                auVar92._4_4_ = fVar69;
                auVar92._0_4_ = fVar69;
                auVar92._8_4_ = fVar69;
                auVar92._12_4_ = fVar69;
                auVar92._16_4_ = fVar69;
                auVar92._20_4_ = fVar69;
                auVar92._24_4_ = fVar69;
                auVar92._28_4_ = fVar69;
                auVar44 = ZEXT1632(CONCAT412(fVar88 + auVar29._12_4_,
                                             CONCAT48(fVar87 + auVar29._8_4_,
                                                      CONCAT44(fVar86 + auVar29._4_4_,fVar69))));
                auVar47 = vpermps_avx512vl(auVar40,auVar44);
                auVar48 = vpermps_avx512vl(auVar42,auVar44);
                auVar44 = vbroadcastss_avx512vl(auVar30);
                auVar49 = vpermps_avx512vl(auVar40,ZEXT1632(auVar30));
                auVar50 = vpermps_avx512vl(auVar42,ZEXT1632(auVar30));
                auVar51 = vbroadcastss_avx512vl(auVar89);
                auVar40 = vpermps_avx512vl(auVar40,ZEXT1632(auVar89));
                auVar42 = vpermps_avx512vl(auVar42,ZEXT1632(auVar89));
                auVar52 = vmulps_avx512vl(auVar51,bezier_basis0._3944_32_);
                auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._2788_32_,auVar44);
                auVar51 = vmulps_avx512vl(auVar51,bezier_basis0._8568_32_);
                auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._7412_32_,auVar44);
                auVar44 = vmulps_avx512vl(auVar40,bezier_basis0._3944_32_);
                auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2788_32_,auVar49);
                auVar40 = vmulps_avx512vl(auVar40,bezier_basis0._8568_32_);
                auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._7412_32_,auVar49);
                auVar49 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
                auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._2788_32_,auVar50);
                auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._1632_32_,auVar92);
                auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._1632_32_,auVar47);
                auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar48);
                auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._476_32_,auVar54);
                auVar53 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._476_32_,auVar41);
                auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar43);
                auVar44._4_4_ = auVar42._4_4_ * bezier_basis0._8572_4_;
                auVar44._0_4_ = auVar42._0_4_ * bezier_basis0._8568_4_;
                auVar44._8_4_ = auVar42._8_4_ * bezier_basis0._8576_4_;
                auVar44._12_4_ = auVar42._12_4_ * bezier_basis0._8580_4_;
                auVar44._16_4_ = auVar42._16_4_ * bezier_basis0._8584_4_;
                auVar44._20_4_ = auVar42._20_4_ * bezier_basis0._8588_4_;
                auVar44._24_4_ = auVar42._24_4_ * bezier_basis0._8592_4_;
                auVar44._28_4_ = auVar42._28_4_;
                auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._7412_32_,auVar50);
                auVar42 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._6256_32_,auVar92);
                auVar47 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._6256_32_,auVar47);
                auVar28 = vfmadd231ps_fma(auVar44,bezier_basis0._6256_32_,auVar48);
                auVar44 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._5100_32_,auVar54);
                auVar41 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._5100_32_,auVar41);
                auVar28 = vfmadd231ps_fma(ZEXT1632(auVar28),bezier_basis0._5100_32_,auVar43);
                auVar42 = vmulps_avx512vl(auVar44,auVar45);
                auVar48 = vmulps_avx512vl(auVar41,auVar45);
                auVar45 = vmulps_avx512vl(ZEXT1632(auVar28),auVar45);
                auVar51 = ZEXT1632(auVar31);
                auVar41 = vblendps_avx(auVar42,auVar51,1);
                auVar43 = vblendps_avx(auVar48,auVar51,1);
                auVar47 = vblendps_avx(auVar45,auVar51,1);
                auVar44 = vsubps_avx(auVar52,auVar41);
                auVar40 = vsubps_avx(auVar53,auVar43);
                auVar50 = vsubps_avx512vl(auVar49,auVar47);
                auVar41 = vblendps_avx(auVar42,auVar51,0x80);
                auVar43 = vblendps_avx(auVar48,auVar51,0x80);
                auVar47 = vblendps_avx(auVar45,auVar51,0x80);
                auVar28 = ZEXT416(0) << 0x40;
                auVar70 = ZEXT464(0) << 0x40;
                auVar51._0_4_ = auVar52._0_4_ + auVar41._0_4_;
                auVar51._4_4_ = auVar52._4_4_ + auVar41._4_4_;
                auVar51._8_4_ = auVar52._8_4_ + auVar41._8_4_;
                auVar51._12_4_ = auVar52._12_4_ + auVar41._12_4_;
                auVar51._16_4_ = auVar52._16_4_ + auVar41._16_4_;
                auVar51._20_4_ = auVar52._20_4_ + auVar41._20_4_;
                auVar51._24_4_ = auVar52._24_4_ + auVar41._24_4_;
                auVar51._28_4_ = auVar52._28_4_ + auVar41._28_4_;
                auVar55._0_4_ = auVar53._0_4_ + auVar43._0_4_;
                auVar55._4_4_ = auVar53._4_4_ + auVar43._4_4_;
                auVar55._8_4_ = auVar53._8_4_ + auVar43._8_4_;
                auVar55._12_4_ = auVar53._12_4_ + auVar43._12_4_;
                auVar55._16_4_ = auVar53._16_4_ + auVar43._16_4_;
                auVar55._20_4_ = auVar53._20_4_ + auVar43._20_4_;
                auVar55._24_4_ = auVar53._24_4_ + auVar43._24_4_;
                auVar55._28_4_ = auVar53._28_4_ + auVar43._28_4_;
                auVar42 = vaddps_avx512vl(auVar49,auVar47);
                auVar41 = vminps_avx512vl(auVar46,auVar52);
                auVar43 = vminps_avx512vl(auVar46,auVar53);
                auVar47 = vminps_avx512vl(auVar46,auVar49);
                auVar45 = vminps_avx512vl(auVar44,auVar51);
                auVar45 = vminps_avx512vl(auVar41,auVar45);
                auVar41 = vminps_avx512vl(auVar40,auVar55);
                auVar46 = vminps_avx512vl(auVar43,auVar41);
                auVar41 = vminps_avx512vl(auVar50,auVar42);
                auVar48 = vminps_avx512vl(auVar47,auVar41);
                auVar98 = ZEXT1664(local_108);
                auVar41 = vmaxps_avx(auVar44,auVar51);
                auVar43 = vmaxps_avx512vl(auVar56,auVar52);
                auVar43 = vmaxps_avx(auVar43,auVar41);
                auVar41 = vmaxps_avx(auVar40,auVar55);
                auVar47 = vmaxps_avx512vl(auVar56,auVar53);
                auVar47 = vmaxps_avx(auVar47,auVar41);
                auVar41 = vmaxps_avx(auVar50,auVar42);
                auVar44 = vmaxps_avx512vl(auVar56,auVar49);
                auVar44 = vmaxps_avx(auVar44,auVar41);
                auVar41 = vshufps_avx(auVar45,auVar45,0xb1);
                auVar41 = vminps_avx(auVar45,auVar41);
                auVar40 = vshufpd_avx(auVar41,auVar41,5);
                auVar41 = vminps_avx(auVar41,auVar40);
                auVar29 = vminps_avx(auVar41._0_16_,auVar41._16_16_);
                auVar41 = vshufps_avx512vl(auVar46,auVar46,0xb1);
                auVar40 = vminps_avx512vl(auVar46,auVar41);
                auVar31 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
                auVar96 = ZEXT1664(auVar31);
                auVar41 = vshufpd_avx(auVar40,auVar40,5);
                auVar41 = vminps_avx(auVar40,auVar41);
                auVar30 = vminps_avx(auVar41._0_16_,auVar41._16_16_);
                auVar30 = vunpcklps_avx(auVar29,auVar30);
                auVar41 = vshufps_avx512vl(auVar48,auVar48,0xb1);
                auVar42 = vminps_avx512vl(auVar48,auVar41);
                auVar41._16_16_ = auVar42._16_16_;
                auVar41._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
                auVar97 = ZEXT1664(auVar41._0_16_);
                auVar40 = vshufpd_avx(auVar42,auVar42,5);
                auVar40 = vminps_avx(auVar42,auVar40);
                auVar29 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
                auVar29 = vinsertps_avx(auVar30,auVar29,0x28);
                auVar30 = vminps_avx(auVar26,auVar29);
                auVar40 = vshufps_avx(auVar43,auVar43,0xb1);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar40 = vshufpd_avx(auVar43,auVar43,5);
                auVar43 = vmaxps_avx(auVar43,auVar40);
                auVar26 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
                auVar43 = vshufps_avx(auVar47,auVar47,0xb1);
                auVar43 = vmaxps_avx(auVar47,auVar43);
                auVar47 = vshufpd_avx(auVar43,auVar43,5);
                auVar43 = vmaxps_avx(auVar43,auVar47);
                auVar29 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
                auVar29 = vunpcklps_avx(auVar26,auVar29);
                auVar43 = vshufps_avx(auVar44,auVar44,0xb1);
                auVar43 = vmaxps_avx(auVar44,auVar43);
                auVar47 = vshufpd_avx(auVar43,auVar43,5);
                auVar43 = vmaxps_avx(auVar43,auVar47);
                auVar26 = vmaxps_avx(auVar43._0_16_,auVar43._16_16_);
                auVar26 = vinsertps_avx(auVar29,auVar26,0x28);
                auVar26 = vmaxps_avx(auVar27,auVar26);
                uVar13 = vcmpps_avx512vl(auVar26,auVar41._0_16_,1);
                uVar14 = vcmpps_avx512vl(auVar30,auVar31,6);
                if ((~((ushort)uVar13 & (ushort)uVar14) & 7) != 0) break;
                uVar21 = uVar21 + 1;
                bVar9 = (ulong)(long)(int)uVar23 < uVar21;
                auVar26 = local_108;
                auVar27 = local_118;
                if ((ulong)(long)(int)uVar23 < uVar21) goto LAB_01f97e61;
                lVar7 = *(long *)((long)&pBVar2[1].super_RawBufferView.ptr_ofs + lVar22);
                lVar8 = *(long *)((long)&pBVar2[1].super_RawBufferView.stride + lVar22);
                auVar26 = *(undefined1 (*) [16])(lVar7 + lVar8 * uVar15);
                lVar22 = lVar22 + 0x38;
                pauVar18 = (undefined1 (*) [16])(lVar8 * uVar16 + lVar7);
                uVar13 = vcmpps_avx512vl(auVar26,auVar31,6);
                uVar14 = vcmpps_avx512vl(auVar26,auVar41._0_16_,1);
              } while ((byte)((byte)uVar13 & (byte)uVar14) == 0xf);
            }
            auVar27 = auVar99._0_16_;
            auVar26 = auVar98._0_16_;
            auVar28 = auVar70._0_16_;
            if (!bVar9) goto LAB_01f9831b;
          }
LAB_01f97e61:
          local_f8.primID = &local_120;
          fVar57 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          auVar26 = vsubss_avx512f(auVar26,ZEXT416((uint)fVar57));
          fVar85 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar57;
          fVar86 = auVar26._0_4_ / fVar85;
          auVar26 = vsubss_avx512f(auVar27,ZEXT416((uint)fVar57));
          fVar85 = auVar26._0_4_ / fVar85;
          fVar57 = fVar12 * fVar86;
          fVar69 = fVar12 * fVar85;
          auVar29 = vroundss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),9);
          auVar30 = vroundss_avx(ZEXT416((uint)fVar69),ZEXT416((uint)fVar69),10);
          auVar26 = vmaxss_avx(auVar29,auVar28);
          auVar27 = vminss_avx(auVar30,ZEXT416((uint)fVar12));
          iVar19 = (int)auVar26._0_4_;
          fVar87 = auVar27._0_4_;
          uVar20 = (int)auVar29._0_4_;
          if ((int)auVar29._0_4_ < 0) {
            uVar20 = 0xffffffff;
          }
          iVar17 = (int)fVar12 + 1;
          if ((int)auVar30._0_4_ < (int)fVar12 + 1) {
            iVar17 = (int)auVar30._0_4_;
          }
          local_120 = uVar25;
          local_f8.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_c8.field_1,&local_f8,(long)iVar19);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_f8,(long)(int)fVar87);
          fVar57 = fVar57 - auVar26._0_4_;
          if (iVar17 - uVar20 == 1) {
            auVar26 = vmaxss_avx(ZEXT416((uint)fVar57),ZEXT816(0) << 0x40);
            fVar57 = auVar26._0_4_;
            fVar12 = 1.0 - fVar57;
            auVar80._0_4_ = fVar57 * local_e8.m128[0];
            auVar80._4_4_ = fVar57 * local_e8.m128[1];
            auVar80._8_4_ = fVar57 * local_e8.m128[2];
            auVar80._12_4_ = fVar57 * local_e8.m128[3];
            auVar62._4_4_ = fVar12;
            auVar62._0_4_ = fVar12;
            auVar62._8_4_ = fVar12;
            auVar62._12_4_ = fVar12;
            auVar37 = vfmadd231ps_fma(auVar80,auVar62,(undefined1  [16])local_c8);
            auVar82._0_4_ = fVar57 * local_d8._0_4_;
            auVar82._4_4_ = fVar57 * local_d8._4_4_;
            auVar82._8_4_ = fVar57 * local_d8._8_4_;
            auVar82._12_4_ = fVar57 * local_d8._12_4_;
            auVar84 = vfmadd231ps_fma(auVar82,local_b8,auVar62);
            auVar26 = vmaxss_avx(ZEXT416((uint)(fVar87 - fVar69)),ZEXT816(0) << 0x40);
            fVar57 = auVar26._0_4_;
            fVar12 = 1.0 - fVar57;
            auVar74._0_4_ = fVar57 * local_c8.m128[0];
            auVar74._4_4_ = fVar57 * local_c8.m128[1];
            auVar74._8_4_ = fVar57 * local_c8.m128[2];
            auVar74._12_4_ = fVar57 * local_c8.m128[3];
            auVar63._4_4_ = fVar12;
            auVar63._0_4_ = fVar12;
            auVar63._8_4_ = fVar12;
            auVar63._12_4_ = fVar12;
            auVar76 = vfmadd231ps_fma(auVar74,auVar63,(undefined1  [16])local_e8);
            auVar71._0_4_ = fVar57 * local_b8._0_4_;
            auVar71._4_4_ = fVar57 * local_b8._4_4_;
            auVar71._8_4_ = fVar57 * local_b8._8_4_;
            auVar71._12_4_ = fVar57 * local_b8._12_4_;
            auVar73 = vfmadd231ps_fma(auVar71,auVar63,local_d8);
            auVar26 = ZEXT816(0);
            auVar27 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
            auVar100 = ZEXT1664(auVar27);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_f8,(long)(iVar19 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_f8,(long)((int)fVar87 + -1));
            auVar26 = vmaxss_avx(ZEXT416((uint)fVar57),ZEXT816(0) << 0x40);
            fVar88 = auVar26._0_4_;
            auVar81._0_4_ = fVar88 * local_58.m128[0];
            auVar81._4_4_ = fVar88 * local_58.m128[1];
            auVar81._8_4_ = fVar88 * local_58.m128[2];
            auVar81._12_4_ = fVar88 * local_58.m128[3];
            fVar57 = 1.0 - fVar88;
            auVar59._4_4_ = fVar57;
            auVar59._0_4_ = fVar57;
            auVar59._8_4_ = fVar57;
            auVar59._12_4_ = fVar57;
            auVar37 = vfmadd231ps_fma(auVar81,auVar59,(undefined1  [16])local_c8);
            auVar83._0_4_ = fVar88 * local_48;
            auVar83._4_4_ = fVar88 * fStack_44;
            auVar83._8_4_ = fVar88 * fStack_40;
            auVar83._12_4_ = fVar88 * fStack_3c;
            auVar84 = vfmadd231ps_fma(auVar83,auVar59,local_b8);
            auVar26 = vmaxss_avx(ZEXT416((uint)(fVar87 - fVar69)),ZEXT816(0) << 0x40);
            fVar69 = auVar26._0_4_;
            fVar57 = 1.0 - fVar69;
            auVar75._0_4_ = fVar69 * local_78.m128[0];
            auVar75._4_4_ = fVar69 * local_78.m128[1];
            auVar75._8_4_ = fVar69 * local_78.m128[2];
            auVar75._12_4_ = fVar69 * local_78.m128[3];
            auVar64._4_4_ = fVar57;
            auVar64._0_4_ = fVar57;
            auVar64._8_4_ = fVar57;
            auVar64._12_4_ = fVar57;
            auVar76 = vfmadd231ps_fma(auVar75,auVar64,(undefined1  [16])local_e8);
            auVar72._0_4_ = fVar69 * local_68;
            auVar72._4_4_ = fVar69 * fStack_64;
            auVar72._8_4_ = fVar69 * fStack_60;
            auVar72._12_4_ = fVar69 * fStack_5c;
            auVar73 = vfmadd231ps_fma(auVar72,auVar64,local_d8);
            if ((int)(uVar20 + 1) < iVar17) {
              sVar24 = (size_t)(uVar20 + 1);
              iVar17 = ~uVar20 + iVar17;
              do {
                auVar27 = auVar100._0_16_;
                auVar26 = vcvtsi2ss_avx512f(auVar96._0_16_,(int)sVar24);
                fVar69 = (auVar26._0_4_ / fVar12 - fVar86) / (fVar85 - fVar86);
                fVar57 = 1.0 - fVar69;
                auVar66._0_4_ = auVar76._0_4_ * fVar69;
                fVar77 = auVar76._4_4_;
                auVar66._4_4_ = fVar77 * fVar69;
                fVar78 = auVar76._8_4_;
                auVar66._8_4_ = fVar78 * fVar69;
                fVar79 = auVar76._12_4_;
                auVar66._12_4_ = fVar79 * fVar69;
                auVar65._4_4_ = fVar57;
                auVar65._0_4_ = fVar57;
                auVar65._8_4_ = fVar57;
                auVar65._12_4_ = fVar57;
                auVar26 = vfmadd231ps_fma(auVar66,auVar65,auVar37);
                auVar60._0_4_ = auVar73._0_4_ * fVar69;
                fVar57 = auVar73._4_4_;
                auVar60._4_4_ = fVar57 * fVar69;
                fVar87 = auVar73._8_4_;
                auVar60._8_4_ = fVar87 * fVar69;
                fVar88 = auVar73._12_4_;
                auVar60._12_4_ = fVar88 * fVar69;
                local_a8 = vfmadd231ps_fma(auVar60,auVar84,auVar65);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_f8,sVar24);
                local_1a8 = auVar84._0_4_;
                fStack_1a4 = auVar84._4_4_;
                fStack_1a0 = auVar84._8_4_;
                fStack_19c = auVar84._12_4_;
                local_1e8 = auVar37._0_4_;
                fStack_1e4 = auVar37._4_4_;
                fStack_1e0 = auVar37._8_4_;
                fStack_1dc = auVar37._12_4_;
                auVar28 = vxorps_avx512vl(auVar27,auVar27);
                auVar100 = ZEXT1664(auVar28);
                auVar26 = vsubps_avx((undefined1  [16])local_98,auVar26);
                auVar27 = vsubps_avx(local_88,local_a8);
                auVar26 = vminps_avx512vl(auVar26,auVar28);
                auVar27 = vmaxps_avx512vl(auVar27,auVar28);
                auVar37._0_4_ = local_1e8 + auVar26._0_4_;
                auVar37._4_4_ = fStack_1e4 + auVar26._4_4_;
                auVar37._8_4_ = fStack_1e0 + auVar26._8_4_;
                auVar37._12_4_ = fStack_1dc + auVar26._12_4_;
                auVar76._0_4_ = auVar76._0_4_ + auVar26._0_4_;
                auVar76._4_4_ = fVar77 + auVar26._4_4_;
                auVar76._8_4_ = fVar78 + auVar26._8_4_;
                auVar76._12_4_ = fVar79 + auVar26._12_4_;
                auVar84._0_4_ = local_1a8 + auVar27._0_4_;
                auVar84._4_4_ = fStack_1a4 + auVar27._4_4_;
                auVar84._8_4_ = fStack_1a0 + auVar27._8_4_;
                auVar84._12_4_ = fStack_19c + auVar27._12_4_;
                auVar73._0_4_ = auVar73._0_4_ + auVar27._0_4_;
                auVar73._4_4_ = fVar57 + auVar27._4_4_;
                auVar73._8_4_ = fVar87 + auVar27._8_4_;
                auVar73._12_4_ = fVar88 + auVar27._12_4_;
                sVar24 = sVar24 + 1;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
            }
            else {
              auVar26 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
              auVar100 = ZEXT1664(auVar26);
            }
            auVar26 = ZEXT816(0) << 0x20;
          }
          auVar70 = ZEXT1664(auVar26 << 0x20);
          uVar13 = vcmpps_avx512vl(auVar37,auVar84,2);
          auVar98 = ZEXT1664(local_108);
          auVar99 = ZEXT1664(local_118);
          auVar26 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
          auVar96 = ZEXT1664(auVar26);
          auVar26 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar97 = ZEXT1664(auVar26);
          if (((~(ushort)uVar13 & 7) == 0) &&
             (uVar13 = vcmpps_avx512vl(auVar76,auVar73,2), (~(ushort)uVar13 & 7) == 0)) {
            auVar26 = vminps_avx(auVar37,auVar76);
            aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar26,ZEXT416(geomID),0x30);
            auVar26 = vmaxps_avx(auVar84,auVar73);
            aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                     vinsertps_avx(auVar26,ZEXT416((uint)uVar25),0x30);
            auVar67._0_4_ = aVar10.x + aVar11.x;
            auVar67._4_4_ = aVar10.y + aVar11.y;
            auVar67._8_4_ = aVar10.z + aVar11.z;
            auVar67._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
            local_168 = vminps_avx(local_168,(undefined1  [16])aVar10);
            local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar11);
            local_188 = vminps_avx(local_188,auVar67);
            local_198 = vmaxps_avx(local_198,auVar67);
            local_1c0 = local_1c0 + 1;
            prims[local_1b8].lower.field_0.field_1 = aVar10;
            prims[local_1b8].upper.field_0.field_1 = aVar11;
            local_1b8 = local_1b8 + 1;
          }
        }
LAB_01f9831b:
        uVar25 = uVar25 + 1;
      } while (uVar25 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1c0;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }